

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form7_Threshold(ThresholdDoubleForm3 Threshold)

{
  byte value;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte minimum;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image output;
  Image input;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&input,value,0,0,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  uVar3 = rand();
  minimum = (byte)((ulong)uVar3 % 0xff);
  bVar1 = Test_Helper::randomValue<unsigned_char>(minimum,0xff);
  (*Threshold)(&output,&input,roiX,roiY,roiWidth,roiHeight,minimum,bVar1);
  bVar2 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar2) {
    bVar2 = Unit_Test::verifyImage(&output,-(value <= bVar1 && minimum <= value));
  }
  else {
    bVar2 = false;
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  return bVar2;
}

Assistant:

bool form7_Threshold(ThresholdDoubleForm3 Threshold)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const uint8_t minThreshold = randomValue <uint8_t>( 255 );
        const uint8_t maxThreshold = randomValue <uint8_t>( minThreshold, 255 );

        const PenguinV_Image::Image output = Threshold( input, roiX, roiY, roiWidth, roiHeight, minThreshold, maxThreshold );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, intensity < minThreshold || intensity > maxThreshold ? 0 : 255 );
    }